

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  LogMessage *other;
  int s;
  int s_00;
  char *pcVar1;
  pair<const_char_*,_bool> pVar2;
  LogMessage local_78;
  anon_class_8_1_ba1d7991 local_40;
  LogFinisher local_31;
  
  str->_M_string_length = 0;
  *(str->_M_dataplus)._M_p = '\0';
  pcVar1 = this->buffer_end_;
  if ((long)size <= (long)(pcVar1 + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
    pcVar1 = this->buffer_end_;
  }
  s_00 = ((int)pcVar1 - (int)ptr) + 0x10;
  local_40.str = str;
  do {
    s = size - s_00;
    if (s == 0 || size < s_00) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.h"
                 ,0x12a);
      other = LogMessage::operator<<(&local_78,"CHECK failed: size > chunk_size: ");
      LogFinisher::operator=(&local_31,other);
      LogMessage::~LogMessage(&local_78);
    }
    ReadStringFallback::anon_class_8_1_ba1d7991::operator()(&local_40,ptr,s_00);
    if (this->limit_ == 0x10) {
      return (char *)0x0;
    }
    pVar2 = DoneFallback(this,ptr + s_00,-1);
    ptr = pVar2.first;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)0x0;
    }
    s_00 = (*(int *)&this->buffer_end_ - (int)pVar2.first) + 0x10;
    size = s;
  } while (s_00 < s);
  ReadStringFallback::anon_class_8_1_ba1d7991::operator()(&local_40,ptr,s);
  return ptr + s;
}

Assistant:

const char* EpsCopyInputStream::ReadStringFallback(const char* ptr, int size,
                                                   std::string* str) {
  str->clear();
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}